

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

MainFunc __thiscall capnp::compiler::CompilerMain::getCompileMain(CompilerMain *this)

{
  ProcessContext *context;
  StringPtr extendedDescription;
  Iface *extraout_RDX;
  CompilerMain *in_RSI;
  MainFunc MVar1;
  StringPtr local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  undefined1 local_28 [8];
  MainBuilder builder;
  CompilerMain *this_local;
  
  context = in_RSI->context;
  kj::StringPtr::StringPtr((StringPtr *)&local_38,"Cap\'n Proto version (unknown)");
  kj::StringPtr::StringPtr
            ((StringPtr *)&local_48,
             "Compiles Cap\'n Proto schema files and generates corresponding source code in one or more languages."
            );
  kj::StringPtr::StringPtr(&local_58,(void *)0x0);
  extendedDescription.content.size_ = local_58.content.size_;
  extendedDescription.content.ptr = local_58.content.ptr;
  kj::MainBuilder::MainBuilder
            ((MainBuilder *)local_28,context,(StringPtr)local_38,(StringPtr)local_48,
             extendedDescription);
  addGlobalOptions(in_RSI,(MainBuilder *)local_28);
  addCompileOptions(in_RSI,(MainBuilder *)local_28);
  kj::MainBuilder::build((MainBuilder *)this);
  kj::MainBuilder::~MainBuilder((MainBuilder *)local_28);
  MVar1.impl.ptr = extraout_RDX;
  MVar1.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar1.impl;
}

Assistant:

kj::MainFunc getCompileMain() {
    kj::MainBuilder builder(context, VERSION_STRING,
          "Compiles Cap'n Proto schema files and generates corresponding source code in one or "
          "more languages.");
    addGlobalOptions(builder);
    addCompileOptions(builder);
    return builder.build();
  }